

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O2

int ngram_search_find_exit(ngram_search_t *ngs,int frame_idx,int32 *out_best_score)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bptbl_t *pbVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  
  iVar1 = ngs->n_frame;
  iVar6 = -1;
  if (iVar1 != 0) {
    uVar5 = (ulong)(iVar1 - 1U);
    if (frame_idx < iVar1) {
      uVar5 = (ulong)(uint)frame_idx;
    }
    if (frame_idx == -1) {
      uVar5 = (ulong)(iVar1 - 1U);
    }
    iVar1 = ngs->bp_table_idx[(int)uVar5];
    do {
      if ((int)uVar5 < 0) {
        return -1;
      }
      iVar6 = ngs->bp_table_idx[uVar5];
      uVar7 = (ulong)iVar6;
      uVar5 = (ulong)((int)uVar5 - 1);
    } while (iVar6 == iVar1);
    if (ngs->bp_table_size <= iVar1) {
      __assert_fail("end_bpidx < ngs->bp_table_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                    ,0x20f,"int ngram_search_find_exit(ngram_search_t *, int, int32 *)");
    }
    lVar8 = uVar7 * 0x24 + 0x10;
    iVar9 = -0x20000000;
    uVar5 = 0xffffffffffffffff;
    do {
      iVar6 = (int)uVar5;
      if ((long)iVar1 <= (long)uVar7) break;
      pbVar4 = ngs->bp_table;
      iVar2 = *(int *)((long)pbVar4 + lVar8 + -8);
      iVar3 = (ngs->base).finish_wid;
      if (iVar2 == iVar3) {
        iVar6 = *(int *)((long)&pbVar4->frame + lVar8);
LAB_001331f0:
        uVar5 = uVar7 & 0xffffffff;
        iVar9 = iVar6;
      }
      else {
        iVar6 = *(int *)((long)&pbVar4->frame + lVar8);
        if (iVar9 < iVar6) goto LAB_001331f0;
      }
      iVar6 = (int)uVar5;
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x24;
    } while (iVar2 != iVar3);
    if (out_best_score != (int32 *)0x0) {
      *out_best_score = iVar9;
    }
  }
  return iVar6;
}

Assistant:

int
ngram_search_find_exit(ngram_search_t *ngs, int frame_idx, int32 *out_best_score)
{
    /* End of backpointers for this frame. */
    int end_bpidx;
    int best_exit, bp;
    int32 best_score;

    /* No hypothesis means no exit node! */
    if (ngs->n_frame == 0)
        return NO_BP;

    if (frame_idx == -1 || frame_idx >= ngs->n_frame)
        frame_idx = ngs->n_frame - 1;
    end_bpidx = ngs->bp_table_idx[frame_idx];

    best_score = WORST_SCORE;
    best_exit = NO_BP;

    /* Scan back to find a frame with some backpointers in it. */
    while (frame_idx >= 0 && ngs->bp_table_idx[frame_idx] == end_bpidx)
        --frame_idx;
    /* This is NOT an error, it just means there is no hypothesis yet. */
    if (frame_idx < 0)
        return NO_BP;

    /* Now find the entry for </s> OR the best scoring entry. */
    assert(end_bpidx < ngs->bp_table_size);
    for (bp = ngs->bp_table_idx[frame_idx]; bp < end_bpidx; ++bp) {
        if (ngs->bp_table[bp].wid == ps_search_finish_wid(ngs)
            || ngs->bp_table[bp].score BETTER_THAN best_score) {
            best_score = ngs->bp_table[bp].score;
            best_exit = bp;
        }
        if (ngs->bp_table[bp].wid == ps_search_finish_wid(ngs))
            break;
    }

    if (out_best_score) {
	*out_best_score = best_score;
    }
    return best_exit;
}